

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::RenderMouseCursor
               (ImDrawList *draw_list,ImVec2 pos,float scale,ImGuiMouseCursor mouse_cursor)

{
  bool bVar1;
  ImFontAtlas *this;
  int in_ESI;
  CustomRect *in_RDI;
  ImTextureID tex_id;
  ImVec2 uv [4];
  ImVec2 size;
  ImVec2 offset;
  ImFontAtlas *font_atlas;
  ImU32 col_fill;
  ImU32 col_border;
  ImU32 col_shadow;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe3c;
  ImDrawList *in_stack_fffffffffffffe40;
  ImVec2 *this_00;
  ImVec2 *b;
  ImVec2 *in_stack_fffffffffffffe70;
  ImVec2 *this_01;
  float _y;
  undefined4 in_stack_fffffffffffffe7c;
  float _x;
  ImDrawList *in_stack_fffffffffffffe80;
  ImDrawList *this_02;
  ImU32 IVar3;
  undefined8 in_stack_fffffffffffffe90;
  ImVec2 *pIVar4;
  ImVec2 *in_stack_fffffffffffffec0;
  ImVec2 *in_stack_fffffffffffffec8;
  ImVec2 *in_stack_fffffffffffffed0;
  ImFontAtlas *this_03;
  ImFontAtlas *pIVar5;
  undefined1 local_e8 [24];
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 *local_70;
  undefined1 local_68 [40];
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  int local_24;
  undefined4 local_20;
  undefined4 local_1c;
  CustomRect *local_10;
  ImVec2 local_8;
  
  if (in_ESI != -1) {
    local_1c = 0x30000000;
    local_20 = 0xff000000;
    local_24 = -1;
    local_30 = *(ImVec2 *)(*(long *)((long)*(ImVec2 *)((long)(in_RDI + 1) + 0x18) + 8) + 0x58);
    local_10 = in_RDI;
    ImVec2::ImVec2(&local_38);
    ImVec2::ImVec2(&local_40);
    pIVar5 = (ImFontAtlas *)((ImVec2 *)local_68 + 4);
    this = (ImFontAtlas *)local_68;
    do {
      this_03 = this;
      ImVec2::ImVec2((ImVec2 *)this_03);
      IVar3 = (ImU32)in_stack_fffffffffffffe90;
      this = (ImFontAtlas *)&this_03->TexID;
    } while (this != pIVar5);
    bVar1 = ImFontAtlas::GetMouseCursorTexData
                      (this,(ImGuiMouseCursor)((ulong)pIVar5 >> 0x20),(ImVec2 *)this_03,
                       in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
                      );
    if (bVar1) {
      operator-=(&local_8,&local_38);
      local_70 = *(ImVec2 **)((long)local_30 + 8);
      ImDrawList::PushTextureID
                (in_stack_fffffffffffffe40,
                 (ImTextureID)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
      _y = 0.0;
      b = local_70;
      ImVec2::ImVec2(&local_88,1.0,0.0);
      local_80 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           0.0);
      local_78 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           (ImVec2 *)0x15117e);
      this_00 = &local_a8;
      ImVec2::ImVec2(this_00,1.0,_y);
      local_a0 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           0.0);
      local_98 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           (ImVec2 *)0x1511d9);
      local_b0 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           0.0);
      local_90 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                           (ImVec2 *)0x15121e);
      uVar2 = 0x30000000;
      ImDrawList::AddImage
                (in_stack_fffffffffffffe80,(ImTextureID)CONCAT44(in_stack_fffffffffffffe7c,_y),
                 in_stack_fffffffffffffe70,b,(ImVec2 *)local_10,this_00,IVar3);
      this_01 = &local_c8;
      _x = 2.0;
      pIVar4 = local_70;
      ImVec2::ImVec2(this_01,2.0,_y);
      IVar3 = (ImU32)pIVar4;
      local_c0 = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,uVar2),0.0);
      local_b8 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,uVar2),(ImVec2 *)0x1512da);
      this_02 = (ImDrawList *)local_e8;
      ImVec2::ImVec2((ImVec2 *)this_02,_x,_y);
      local_e8._8_8_ = operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,uVar2),0.0);
      local_e8._16_8_ =
           operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,uVar2),(ImVec2 *)0x151335);
      operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,uVar2),0.0);
      local_d0 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,uVar2),(ImVec2 *)0x151372);
      uVar2 = 0x30000000;
      ImDrawList::AddImage
                (this_02,(ImTextureID)CONCAT44(_x,_y),this_01,b,(ImVec2 *)local_10,this_00,IVar3);
      operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,uVar2),0.0);
      operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,uVar2),(ImVec2 *)0x1513fb);
      uVar2 = 0xff000000;
      ImDrawList::AddImage
                (this_02,(ImTextureID)CONCAT44(_x,_y),this_01,b,(ImVec2 *)local_10,this_00,IVar3);
      operator*((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,uVar2),0.0);
      operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe3c,uVar2),(ImVec2 *)0x15148a);
      ImDrawList::AddImage
                (this_02,(ImTextureID)CONCAT44(_x,_y),this_01,b,(ImVec2 *)local_10,this_00,IVar3);
      ImDrawList::PopTextureID(in_stack_fffffffffffffe40);
    }
  }
  return;
}

Assistant:

void ImGui::RenderMouseCursor(ImDrawList* draw_list, ImVec2 pos, float scale, ImGuiMouseCursor mouse_cursor)
{
    if (mouse_cursor == ImGuiMouseCursor_None)
        return;
    IM_ASSERT(mouse_cursor > ImGuiMouseCursor_None && mouse_cursor < ImGuiMouseCursor_COUNT);

    const ImU32 col_shadow = IM_COL32(0, 0, 0, 48);
    const ImU32 col_border = IM_COL32(0, 0, 0, 255);          // Black
    const ImU32 col_fill   = IM_COL32(255, 255, 255, 255);    // White

    ImFontAtlas* font_atlas = draw_list->_Data->Font->ContainerAtlas;
    ImVec2 offset, size, uv[4];
    if (font_atlas->GetMouseCursorTexData(mouse_cursor, &offset, &size, &uv[0], &uv[2]))
    {
        pos -= offset;
        const ImTextureID tex_id = font_atlas->TexID;
        draw_list->PushTextureID(tex_id);
        draw_list->AddImage(tex_id, pos + ImVec2(1,0)*scale, pos + ImVec2(1,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos + ImVec2(2,0)*scale, pos + ImVec2(2,0)*scale + size*scale, uv[2], uv[3], col_shadow);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[2], uv[3], col_border);
        draw_list->AddImage(tex_id, pos,                     pos + size*scale,                     uv[0], uv[1], col_fill);
        draw_list->PopTextureID();
    }
}